

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtob(StringPiece str,bool *value)

{
  StringPiece s2;
  StringPiece s2_00;
  StringPiece s2_01;
  StringPiece s2_02;
  StringPiece s2_03;
  StringPiece s2_04;
  StringPiece s2_05;
  StringPiece s2_06;
  StringPiece s2_07;
  StringPiece s2_08;
  bool bVar1;
  undefined1 *in_RDX;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  bool bVar2;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 uVar3;
  undefined8 in_stack_fffffffffffffe38;
  LogMessage *in_stack_fffffffffffffe40;
  LogMessage *in_stack_fffffffffffffe48;
  StringPiece in_stack_fffffffffffffe50;
  LogMessage local_58;
  undefined1 *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  if (in_RDX == (undefined1 *)0x0) {
    in_stack_fffffffffffffe40 = &local_58;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffe40,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe37,
                                CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
               in_stack_fffffffffffffe2c);
    in_stack_fffffffffffffe48 =
         internal::LogMessage::operator<<
                   ((LogMessage *)
                    CONCAT17(in_stack_fffffffffffffe37,
                             CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                    (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    internal::LogMessage::operator<<
              ((LogMessage *)
               CONCAT17(in_stack_fffffffffffffe37,
                        CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    internal::LogFinisher::operator=
              ((LogFinisher *)
               CONCAT17(in_stack_fffffffffffffe37,
                        CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    internal::LogMessage::~LogMessage((LogMessage *)0x4081f1);
  }
  StringPiece::StringPiece
            ((StringPiece *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  s2.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
  s2.ptr_ = (char *)in_stack_fffffffffffffe40;
  bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2);
  uVar3 = true;
  if (!bVar1) {
    StringPiece::StringPiece
              ((StringPiece *)
               CONCAT17(1,CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    s2_00.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
    s2_00.ptr_ = (char *)in_stack_fffffffffffffe40;
    bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_00);
    uVar3 = true;
    if (!bVar1) {
      StringPiece::StringPiece
                ((StringPiece *)
                 CONCAT17(1,CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                 (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      s2_01.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
      s2_01.ptr_ = (char *)in_stack_fffffffffffffe40;
      bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_01);
      uVar3 = true;
      if (!bVar1) {
        StringPiece::StringPiece
                  ((StringPiece *)
                   CONCAT17(1,CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                   (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        s2_02.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
        s2_02.ptr_ = (char *)in_stack_fffffffffffffe40;
        bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_02);
        uVar3 = true;
        if (!bVar1) {
          StringPiece::StringPiece
                    ((StringPiece *)
                     CONCAT17(1,CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          s2_03.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
          s2_03.ptr_ = (char *)in_stack_fffffffffffffe40;
          uVar3 = CaseEqual(in_stack_fffffffffffffe50,s2_03);
        }
      }
    }
  }
  if ((bool)uVar3 == false) {
    StringPiece::StringPiece
              ((StringPiece *)(ulong)CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30),
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    s2_04.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
    s2_04.ptr_ = (char *)in_stack_fffffffffffffe40;
    bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_04);
    bVar2 = true;
    if (!bVar1) {
      StringPiece::StringPiece
                ((StringPiece *)CONCAT17(uVar3,CONCAT16(1,in_stack_fffffffffffffe30)),
                 (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      s2_05.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
      s2_05.ptr_ = (char *)in_stack_fffffffffffffe40;
      bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_05);
      bVar2 = true;
      if (!bVar1) {
        StringPiece::StringPiece
                  ((StringPiece *)CONCAT17(uVar3,CONCAT16(1,in_stack_fffffffffffffe30)),
                   (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        s2_06.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
        s2_06.ptr_ = (char *)in_stack_fffffffffffffe40;
        bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_06);
        bVar2 = true;
        if (!bVar1) {
          StringPiece::StringPiece
                    ((StringPiece *)CONCAT17(uVar3,CONCAT16(1,in_stack_fffffffffffffe30)),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          s2_07.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
          s2_07.ptr_ = (char *)in_stack_fffffffffffffe40;
          bVar1 = CaseEqual(in_stack_fffffffffffffe50,s2_07);
          bVar2 = true;
          if (!bVar1) {
            StringPiece::StringPiece
                      ((StringPiece *)CONCAT17(uVar3,CONCAT16(1,in_stack_fffffffffffffe30)),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            s2_08.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe48;
            s2_08.ptr_ = (char *)in_stack_fffffffffffffe40;
            bVar2 = CaseEqual(in_stack_fffffffffffffe50,s2_08);
          }
        }
      }
    }
    if (bVar2 == false) {
      local_1 = false;
    }
    else {
      *local_20 = 0;
      local_1 = true;
    }
  }
  else {
    *local_20 = 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}